

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

SignatureT __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
          (TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,ParamsT *params,ResultsT *results)

{
  ParseTypeDefsCtx *pPVar1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_d0;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_c0;
  uintptr_t local_a8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_a0;
  Type local_88;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_80;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *resultTypes;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_68;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *local_50;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *paramTypes;
  vector<wasm::Type,_std::allocator<wasm::Type>_> empty;
  ResultsT *results_local;
  ParamsT *params_local;
  TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this_local;
  
  empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)results;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&paramTypes);
  if (params == (ParamsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (&local_68,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)&paramTypes);
  }
  else {
    getUnnamedTypes(&local_68,params);
  }
  local_50 = &local_68;
  if (empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    local_d0 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&paramTypes;
  }
  else {
    local_d0 = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
  local_80 = local_d0;
  pPVar1 = self(this);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_a0,local_50);
  local_88.id = (uintptr_t)ParseTypeDefsCtx::makeTupleType(pPVar1,&local_a0);
  pPVar1 = self(this);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_c0,local_80);
  local_a8 = (uintptr_t)ParseTypeDefsCtx::makeTupleType(pPVar1,&local_c0);
  Signature::Signature((Signature *)&this_local,local_88,(Type)local_a8);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_c0);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_a0);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_68);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&paramTypes);
  return _this_local;
}

Assistant:

SignatureT makeFuncType(ParamsT* params, ResultsT* results) {
    std::vector<Type> empty;
    const auto& paramTypes = params ? getUnnamedTypes(*params) : empty;
    const auto& resultTypes = results ? *results : empty;
    return Signature(self().makeTupleType(paramTypes),
                     self().makeTupleType(resultTypes));
  }